

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::ExceptionOr<kj::Maybe<kj::OwnFd>_>::ExceptionOr
          (ExceptionOr<kj::Maybe<kj::OwnFd>_> *this,Maybe<kj::OwnFd> *value)

{
  (this->super_ExceptionOrValue).exception.ptr.isSet = false;
  NullableValue<kj::Maybe<kj::OwnFd>_>::NullableValue(&(this->value).ptr,value);
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}